

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGeometryUtil.cpp
# Opt level: O2

void cbtGeometryUtil::getPlaneEquationsFromVertices
               (cbtAlignedObjectArray<cbtVector3> *vertices,
               cbtAlignedObjectArray<cbtVector3> *planeEquationsOut)

{
  uint uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  cbtVector3 *v2;
  int iVar4;
  cbtVector3 *v1;
  bool bVar5;
  undefined1 auVar6 [16];
  cbtScalar cVar7;
  undefined8 uVar10;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  float fVar14;
  cbtVector3 cVar15;
  uint local_bc;
  uint local_b8;
  long local_a8;
  cbtVector3 local_a0;
  ulong local_90;
  ulong local_88;
  long local_80;
  cbtVector3 *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  uVar1 = vertices->m_size;
  local_90 = (ulong)(~((int)uVar1 >> 0x1f) & uVar1);
  local_a8 = 1;
  local_bc = 2;
  for (local_88 = 0; local_88 != local_90; local_88 = local_88 + 1) {
    v2 = vertices->m_data + local_88;
    local_b8 = local_bc;
    for (local_80 = local_a8; (int)local_80 < (int)uVar1; local_80 = local_80 + 1) {
      local_70 = (ulong)local_b8;
      local_78 = vertices->m_data + local_80;
      while( true ) {
        auVar13 = in_ZMM1._8_56_;
        auVar11 = in_ZMM0._8_56_;
        if ((int)uVar1 <= (int)local_70) break;
        v1 = vertices->m_data + local_70;
        cVar15 = ::operator-(local_78,v2);
        auVar12._0_8_ = cVar15.m_floats._8_8_;
        auVar12._8_56_ = auVar13;
        auVar8._0_8_ = cVar15.m_floats._0_8_;
        auVar8._8_56_ = auVar11;
        local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
        auVar11 = ZEXT856(local_40.m_floats._8_8_);
        cVar15 = ::operator-(v1,v2);
        in_ZMM1._0_8_ = cVar15.m_floats._8_8_;
        in_ZMM1._8_56_ = auVar13;
        auVar9._0_8_ = cVar15.m_floats._0_8_;
        auVar9._8_56_ = auVar11;
        local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,in_ZMM1._0_16_);
        iVar4 = 2;
        in_ZMM0 = ZEXT464(0x3f800000);
        while( true ) {
          uVar10 = in_ZMM0._8_8_;
          bVar5 = iVar4 == 0;
          iVar4 = iVar4 + -1;
          if (bVar5) break;
          local_68 = in_ZMM0._0_16_;
          cVar15 = cbtVector3::cross(&local_40,&local_50);
          fVar14 = local_68._0_4_;
          fVar2 = fVar14 * cVar15.m_floats[2];
          in_ZMM1 = ZEXT464((uint)fVar2);
          auVar6._0_4_ = fVar14 * cVar15.m_floats[0];
          auVar6._4_4_ = fVar14 * cVar15.m_floats[1];
          auVar6._8_4_ = fVar14 * (float)uVar10;
          auVar6._12_4_ = fVar14 * (float)((ulong)uVar10 >> 0x20);
          local_a0.m_floats = (cbtScalar  [4])vinsertps_avx(auVar6,ZEXT416((uint)fVar2),0x28);
          cVar7 = cbtVector3::length2(&local_a0);
          if (0.0001 < cVar7) {
            cbtVector3::normalize(&local_a0);
            bVar5 = notExist(&local_a0,planeEquationsOut);
            if (bVar5) {
              auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_a0.m_floats[1] * v2->m_floats[1])),
                                       ZEXT416((uint)local_a0.m_floats[0]),
                                       ZEXT416((uint)v2->m_floats[0]));
              in_ZMM1 = ZEXT1664(auVar6);
              auVar6 = vfmadd132ss_fma(ZEXT416((uint)local_a0.m_floats[2]),auVar6,
                                       ZEXT416((uint)v2->m_floats[2]));
              auVar3._8_4_ = 0x80000000;
              auVar3._0_8_ = 0x8000000080000000;
              auVar3._12_4_ = 0x80000000;
              auVar6 = vxorps_avx512vl(auVar6,auVar3);
              local_a0.m_floats[3] = auVar6._0_4_;
              bVar5 = areVerticesBehindPlane(&local_a0,vertices,0.01);
              if (bVar5) {
                cbtAlignedObjectArray<cbtVector3>::push_back(planeEquationsOut,&local_a0);
              }
            }
          }
          in_ZMM0 = ZEXT464(0xbf800000);
        }
        local_70 = local_70 + 1;
      }
      local_b8 = local_b8 + 1;
    }
    local_bc = local_bc + 1;
    local_a8 = local_a8 + 1;
  }
  return;
}

Assistant:

void cbtGeometryUtil::getPlaneEquationsFromVertices(cbtAlignedObjectArray<cbtVector3>& vertices, cbtAlignedObjectArray<cbtVector3>& planeEquationsOut)
{
	const int numvertices = vertices.size();
	// brute force:
	for (int i = 0; i < numvertices; i++)
	{
		const cbtVector3& N1 = vertices[i];

		for (int j = i + 1; j < numvertices; j++)
		{
			const cbtVector3& N2 = vertices[j];

			for (int k = j + 1; k < numvertices; k++)
			{
				const cbtVector3& N3 = vertices[k];

				cbtVector3 planeEquation, edge0, edge1;
				edge0 = N2 - N1;
				edge1 = N3 - N1;
				cbtScalar normalSign = cbtScalar(1.);
				for (int ww = 0; ww < 2; ww++)
				{
					planeEquation = normalSign * edge0.cross(edge1);
					if (planeEquation.length2() > cbtScalar(0.0001))
					{
						planeEquation.normalize();
						if (notExist(planeEquation, planeEquationsOut))
						{
							planeEquation[3] = -planeEquation.dot(N1);

							//check if inside, and replace supportingVertexOut if needed
							if (areVerticesBehindPlane(planeEquation, vertices, cbtScalar(0.01)))
							{
								planeEquationsOut.push_back(planeEquation);
							}
						}
					}
					normalSign = cbtScalar(-1.);
				}
			}
		}
	}
}